

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O0

void visit_enum_decl(gvisitor_t *self,gnode_enum_decl_t *node)

{
  _Bool _Var1;
  symboltable_t *table;
  gnode_t *local_50;
  long local_48;
  long local_38;
  symboltable_t *symtable;
  gnode_t *top;
  gnode_enum_decl_t *node_local;
  gvisitor_t *self_local;
  
  if (*self->data == 0) {
    local_38 = 0;
  }
  else {
    local_38 = **self->data;
  }
  if (local_38 - 1U < **self->data) {
    if (*self->data == 0) {
      local_48 = 0;
    }
    else {
      local_48 = **self->data;
    }
    local_50 = *(gnode_t **)(*(long *)(*self->data + 0x10) + (local_48 + -1) * 8);
  }
  else {
    local_50 = (gnode_t *)0x0;
  }
  check_access_storage_specifiers(self,&node->base,local_50->tag,node->access,node->storage);
  if ((local_50 != (gnode_t *)0x0) && (local_50->tag == NODE_FUNCTION_DECL)) {
    table = symtable_from_node(local_50);
    _Var1 = symboltable_insert(table,node->identifier,&node->base);
    if (!_Var1) {
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Identifier %s redeclared.",
                   node->identifier);
    }
  }
  return;
}

Assistant:

static void visit_enum_decl (gvisitor_t *self, gnode_enum_decl_t *node) {
    DEBUG_SEMA2("visit_enum_decl %s", node->identifier);

    // check if optional access and storage specifiers make sense in current context
    gnode_t *top = TOP_DECLARATION();
    check_access_storage_specifiers(self, (gnode_t *)node, NODE_TAG(top), node->access, node->storage);
    
    if (NODE_ISA_FUNCTION(top)) {
        // it is a local defined enum
        symboltable_t *symtable = symtable_from_node(top);
        if (!symboltable_insert(symtable, node->identifier, (void *)node)) {
            REPORT_ERROR(node, "Identifier %s redeclared.", node->identifier);
        }
    }
}